

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintThreeBBShaft::ArchiveIN(ChConstraintThreeBBShaft *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChConstraintThreeBBShaft>(marchive);
  ChConstraintThree::ArchiveIN(&this->super_ChConstraintThree,marchive);
  return;
}

Assistant:

void ChConstraintThreeBBShaft::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChConstraintThreeBBShaft>();

    // deserialize the parent class data too
    ChConstraintThree::ArchiveIN(marchive);

    // deserialize all member data:
    // NOTHING INTERESTING TO SERIALIZE (the Cq jacobians are not so
    // important to waste disk space.. they may be recomputed run-time,
    // and pointers to variables must be rebound in run-time.)
    // mstream << Cq_a;
    // mstream << Cq_b;
}